

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

int isNonTemporalSubformula(ltlNode *topNode)

{
  int iVar1;
  bool local_21;
  ltlNode *topNode_local;
  
  switch(topNode->type) {
  case AND:
  case OR:
  case IMPLY:
    iVar1 = isNonTemporalSubformula(topNode->left);
    local_21 = false;
    if (iVar1 != 0) {
      iVar1 = isNonTemporalSubformula(topNode->right);
      local_21 = iVar1 != 0;
    }
    topNode_local._4_4_ = (uint)local_21;
    break;
  case NOT:
    if (topNode->right != (ltlNode_t *)0x0) {
      __assert_fail("topNode->right == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/ltl_parser.c"
                    ,0x28c,"int isNonTemporalSubformula(ltlNode *)");
    }
    topNode_local._4_4_ = isNonTemporalSubformula(topNode->left);
    break;
  default:
    topNode_local._4_4_ = 0;
    break;
  case BOOL:
    topNode_local._4_4_ = 1;
  }
  return topNode_local._4_4_;
}

Assistant:

int isNonTemporalSubformula( ltlNode *topNode )
{
	switch( topNode->type ){
		case AND:
		case OR:
		case IMPLY:
			return isNonTemporalSubformula( topNode->left) && isNonTemporalSubformula( topNode->right ) ;
		case NOT:
			assert( topNode->right == NULL );
			return isNonTemporalSubformula( topNode->left );
		case BOOL:
			return 1;
		default:
			return 0;
	}
}